

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::ReuseLeastRecentlyUsedEntry
          (MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
           *this,RegexKey *key,RegexPattern **value,int dictionaryDataIndex)

{
  MruListEntry *entry;
  char16_t *pcVar1;
  RegexPattern *pRVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  MruDictionaryData *pMVar6;
  
  if (this->mruListCount != this->mruListCapacity) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/MruDictionary.h"
                       ,0x81,"(mruListCount == mruListCapacity)","mruListCount == mruListCapacity");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  entry = (this->entries).tail.ptr;
  pMVar6 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::GetReferenceAt(&this->dictionary,dictionaryDataIndex);
  MruDictionaryData::OnAddedToMruList(pMVar6,entry);
  pMVar6 = BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::GetReferenceAt(&this->dictionary,entry->dictionaryDataIndex);
  MruDictionaryData::OnRemovedFromMruList(pMVar6);
  DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruListEntry,Memory::Recycler>
  ::
  MoveToBeginning<JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruListEntry>
            (entry,&(this->entries).head,&(this->entries).tail);
  pcVar1 = (key->source).ptr;
  Memory::Recycler::WBSetBit((char *)&entry->key);
  (entry->key).source.ptr = pcVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&entry->key);
  (entry->key).flags = key->flags;
  (entry->key).length = key->length;
  pRVar2 = *value;
  Memory::Recycler::WBSetBit((char *)&entry->value);
  (entry->value).ptr = pRVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&entry->value);
  entry->dictionaryDataIndex = dictionaryDataIndex;
  return;
}

Assistant:

void ReuseLeastRecentlyUsedEntry(const TKey &key, const TValue &value, const int dictionaryDataIndex)
        {
            Assert(mruListCount == mruListCapacity);

            // Reuse the least recently used entry for this key/value pair and make it the most recently used
            const auto entry = entries.Tail();
            dictionary.GetReferenceAt(dictionaryDataIndex)->OnAddedToMruList(entry);
            dictionary.GetReferenceAt(entry->dictionaryDataIndex)->OnRemovedFromMruList();
            entries.MoveToBeginning(entry);
            entry->key = key;
            entry->value = value;
            entry->dictionaryDataIndex = dictionaryDataIndex;
        }